

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor.hpp
# Opt level: O2

void __thiscall
soplex::
SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::solveLeft(SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *x,
           VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *y,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *z,SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *rhs1,
           SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *rhs2,SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *rhs3)

{
  int rn2;
  int rn3;
  int *ridx;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *rhs;
  int *idx;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *vec;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *vec2;
  int *ridx2;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *rhs2_00;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *vec3;
  int *ridx3;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *rhs3_00;
  Real val;
  int iVar1;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  epsilon;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_88;
  
  (*this->solveTime->_vptr_Timer[3])();
  ridx = (this->ssvec).super_IdxSet.idx;
  rhs = (this->ssvec).
        super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .val.
        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  (this->ssvec).setupStatus = false;
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_e8,
             &(this->
              super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
  val = Tolerances::epsilon(local_e8._M_ptr);
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
            (&epsilon.m_backend,val,(type *)0x0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e8._M_refcount);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::clear(x);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::clear(y);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::clear(z);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
  ::
  assign<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
            ((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
              *)&this->ssvec,rhs1);
  iVar1 = (this->ssvec).super_IdxSet.num;
  rn2 = (rhs2->super_IdxSet).num;
  rn3 = (rhs3->super_IdxSet).num;
  local_88.m_backend.data._M_elems[0] = epsilon.m_backend.data._M_elems[0];
  local_88.m_backend.data._M_elems[1] = epsilon.m_backend.data._M_elems[1];
  local_88.m_backend.data._M_elems[2] = epsilon.m_backend.data._M_elems[2];
  local_88.m_backend.data._M_elems[3] = epsilon.m_backend.data._M_elems[3];
  local_88.m_backend.data._M_elems[4] = epsilon.m_backend.data._M_elems[4];
  local_88.m_backend.data._M_elems[5] = epsilon.m_backend.data._M_elems[5];
  local_88.m_backend.data._M_elems[6] = epsilon.m_backend.data._M_elems[6];
  local_88.m_backend.data._M_elems[7] = epsilon.m_backend.data._M_elems[7];
  local_88.m_backend.data._M_elems[8] = epsilon.m_backend.data._M_elems[8];
  local_88.m_backend.data._M_elems[9] = epsilon.m_backend.data._M_elems[9];
  local_88.m_backend.data._M_elems[10] = epsilon.m_backend.data._M_elems[10];
  local_88.m_backend.data._M_elems[0xb] = epsilon.m_backend.data._M_elems[0xb];
  local_88.m_backend.data._M_elems[0xc] = epsilon.m_backend.data._M_elems[0xc];
  local_88.m_backend.data._M_elems[0xd] = epsilon.m_backend.data._M_elems[0xd];
  local_88.m_backend.data._M_elems[0xe] = epsilon.m_backend.data._M_elems[0xe];
  local_88.m_backend.data._M_elems[0xf] = epsilon.m_backend.data._M_elems[0xf];
  local_88.m_backend.exp = epsilon.m_backend.exp;
  local_88.m_backend.neg = epsilon.m_backend.neg;
  local_88.m_backend.fpclass = epsilon.m_backend.fpclass;
  local_88.m_backend.prec_elem = epsilon.m_backend.prec_elem;
  idx = (x->super_IdxSet).idx;
  vec = (x->
        super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).val.
        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  x->setupStatus = false;
  vec2 = (y->val).
         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  ridx2 = (rhs2->super_IdxSet).idx;
  rhs2_00 = (rhs2->
            super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  rhs2->setupStatus = false;
  vec3 = (z->val).
         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  ridx3 = (rhs3->super_IdxSet).idx;
  rhs3_00 = (rhs3->
            super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  rhs3->setupStatus = false;
  iVar1 = CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::vSolveLeft3(&this->
                         super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ,&local_88,vec,idx,rhs,ridx,iVar1,vec2,rhs2_00,ridx2,rn2,vec3,rhs3_00,ridx3,
                        rn3);
  x->setupStatus = false;
  (x->super_IdxSet).num = iVar1;
  if (0 < iVar1) {
    x->setupStatus = true;
  }
  (this->ssvec).super_IdxSet.num = 0;
  (this->ssvec).setupStatus = true;
  this->solveCount = this->solveCount + 3;
  (*this->solveTime->_vptr_Timer[4])();
  return;
}

Assistant:

void SLUFactor<R>::solveLeft(
   SSVectorBase<R>&       x,
   VectorBase<R>&        y,
   VectorBase<R>&        z,
   const SVectorBase<R>& rhs1,
   SSVectorBase<R>&       rhs2,
   SSVectorBase<R>&       rhs3)
{

   solveTime->start();

   int   n, n2, n3;
   R* svec = ssvec.altValues();
   int*  sidx = ssvec.altIndexMem();
   R epsilon = this->tolerances()->epsilon();

   x.clear();
   y.clear();
   z.clear();
   ssvec.assign(rhs1);
   n = ssvec.size(); // see altValues();
   n2 = rhs2.size();
   n3 = rhs3.size();

   n = this->vSolveLeft3(epsilon, x.altValues(), x.altIndexMem(), svec, sidx, n,
                         y.get_ptr(), rhs2.altValues(), rhs2.altIndexMem(), n2,
                         z.get_ptr(), rhs3.altValues(), rhs3.altIndexMem(), n3);

   x.setSize(n);

   if(n > 0)
      x.forceSetup();

   ssvec.setSize(0);
   ssvec.forceSetup();

   solveCount += 3;
   solveTime->stop();
}